

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::jettisonnodes(tetgenmesh *this)

{
  uint uVar1;
  memorypool *pmVar2;
  void **ppvVar3;
  tetgenio *ptVar4;
  int *piVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  if (this->b->quiet == 0) {
    puts("Jettisoning redundant points.");
  }
  pmVar2 = this->points;
  ppvVar3 = pmVar2->firstblock;
  pmVar2->pathblock = ppvVar3;
  pmVar2->pathitem =
       (void *)((long)ppvVar3 +
               (((long)pmVar2->alignbytes + 8U) -
               (ulong)(ppvVar3 + 1) % (ulong)(long)pmVar2->alignbytes));
  pmVar2->pathitemsleft = pmVar2->itemsperblock;
  do {
    puVar6 = (undefined8 *)memorypool::traverse(this->points);
    if (puVar6 == (undefined8 *)0x0) {
LAB_00130dfd:
      if (this->b->verbose != 0) {
        printf("  %ld duplicated vertices are removed.\n",this->dupverts);
        printf("  %ld unused vertices are removed.\n",this->unuverts);
      }
      this->dupverts = 0;
      this->unuverts = 0;
      this->points->deaditemstack = (void *)0x0;
      return;
    }
  } while ((*(uint *)((long)puVar6 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0xa00);
  lVar8 = 0;
  iVar9 = 0;
  do {
    lVar7 = (long)this->pointmarkindex;
    uVar1 = *(uint *)((long)puVar6 + lVar7 * 4 + 4);
    if (uVar1 < 0x200) {
      *(uint *)((long)puVar6 + lVar7 * 4 + 4) = uVar1 & 0xff | 0xa00;
      pmVar2 = this->points;
      *puVar6 = pmVar2->deaditemstack;
      pmVar2->deaditemstack = puVar6;
      pmVar2->items = pmVar2->items + -1;
    }
    else {
      ptVar4 = this->in;
      *(int *)((long)puVar6 + lVar7 * 4) = ptVar4->firstnumber + iVar9;
      piVar5 = ptVar4->pointmarkerlist;
      if ((piVar5 != (int *)0x0) && (lVar8 < ptVar4->numberofpoints)) {
        piVar5[iVar9] = piVar5[lVar8];
      }
      iVar9 = iVar9 + 1;
    }
    lVar8 = lVar8 + 1;
    do {
      puVar6 = (undefined8 *)memorypool::traverse(this->points);
      if (puVar6 == (undefined8 *)0x0) goto LAB_00130dfd;
    } while ((*(uint *)((long)puVar6 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0xa00);
  } while( true );
}

Assistant:

void tetgenmesh::jettisonnodes()
{
  point pointloop;
  bool jetflag;
  int oldidx, newidx;
  int remcount;

  if (!b->quiet) {
    printf("Jettisoning redundant points.\n");
  }

  points->traversalinit();
  pointloop = pointtraverse();
  oldidx = newidx = 0; // in->firstnumber;
  remcount = 0;
  while (pointloop != (point) NULL) {
    jetflag = (pointtype(pointloop) == DUPLICATEDVERTEX) || 
      (pointtype(pointloop) == UNUSEDVERTEX);
    if (jetflag) {
      // It is a duplicated or unused point, delete it.
      pointdealloc(pointloop);
      remcount++;
    } else {
      // Re-index it.
      setpointmark(pointloop, newidx + in->firstnumber);
      if (in->pointmarkerlist != (int *) NULL) {
        if (oldidx < in->numberofpoints) {
          // Re-index the point marker as well.
          in->pointmarkerlist[newidx] = in->pointmarkerlist[oldidx];
        }
      }
      newidx++;
    }
    oldidx++;
    pointloop = pointtraverse();
  }
  if (b->verbose) {
    printf("  %ld duplicated vertices are removed.\n", dupverts);
    printf("  %ld unused vertices are removed.\n", unuverts);
  }
  dupverts = 0l;
  unuverts = 0l;

  // The following line ensures that dead items in the pool of nodes cannot
  //   be allocated for the new created nodes. This ensures that the input
  //   nodes will occur earlier in the output files, and have lower indices.
  points->deaditemstack = (void *) NULL;
}